

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
Lodtalk::AST::PragmaDefinition::appendParameter(PragmaDefinition *this,string *keyword,Node *node)

{
  Node *local_18;
  
  local_18 = node;
  std::__cxx11::string::append((string *)&this->selector);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::push_back
            (&this->parameters,&local_18);
  return;
}

Assistant:

void PragmaDefinition::appendParameter(const std::string &keyword, Node *node)
{
    selector += keyword;
    parameters.push_back(node);
}